

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetSilentEntitySystemList
          (Aggregate_State_PDU *this,
          vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
          *SES)

{
  undefined2 uVar1;
  pointer pSVar2;
  KUINT16 KVar3;
  pointer pSVar4;
  
  pSVar2 = (this->m_vSESL).
           super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar4 = (this->m_vSESL).
                super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar2; pSVar4 = pSVar4 + 1) {
    KVar3 = DATA_TYPE::SilentEntitySystem::GetNumberOfAppearanceRecords(pSVar4);
    uVar1 = (this->super_Header).super_Header6.m_ui16PDULength;
    (this->super_Header).super_Header6.m_ui16PDULength = (KVar3 * -4 + uVar1) - 0xc;
  }
  std::
  vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ::operator=(&this->m_vSESL,SES);
  for (pSVar4 = (this->m_vSESL).
                super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar2 = (this->m_vSESL).
               super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
               ._M_impl.super__Vector_impl_data._M_finish, pSVar4 != pSVar2; pSVar4 = pSVar4 + 1) {
    KVar3 = DATA_TYPE::SilentEntitySystem::GetNumberOfAppearanceRecords(pSVar4);
    (this->super_Header).super_Header6.m_ui16PDULength =
         KVar3 * 4 + (this->super_Header).super_Header6.m_ui16PDULength + 0xc;
  }
  this->m_ui16NumSilentEntityTypes =
       (short)((uint)((int)pSVar2 -
                     *(int *)&(this->m_vSESL).
                              super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x6db7;
  return;
}

Assistant:

void Aggregate_State_PDU::SetSilentEntitySystemList( const vector<SilentEntitySystem> & SES )
{
    // Reset the PDU length
    vector<SilentEntitySystem>::const_iterator citr = m_vSESL.begin();
    vector<SilentEntitySystem>::const_iterator citrEnd = m_vSESL.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= SilentEntitySystem::SILENT_ENTITY_SYSTEM_SIZE + ( citr->GetNumberOfAppearanceRecords() * EntityAppearance::ENTITY_APPEARANCE_SIZE );
    }

    m_vSESL = SES;

    for( citr = m_vSESL.begin(); citr!= m_vSESL.end(); ++citr )
    {
        m_ui16PDULength += SilentEntitySystem::SILENT_ENTITY_SYSTEM_SIZE + ( citr->GetNumberOfAppearanceRecords() * EntityAppearance::ENTITY_APPEARANCE_SIZE );
    }

    m_ui16NumSilentEntityTypes = m_vSESL.size();
}